

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O1

shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
nestl::impl::
make_shared_a_nothrow<nestl::impl::set<void*,std::less<void*>,nestl::allocator<void*>>,nestl::has_exceptions::exception_ptr_error,nestl::allocator<nestl::impl::set<void*,std::less<void*>,nestl::allocator<void*>>>>
          (exception_ptr_error *err,
          allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
          *param_2)

{
  undefined1 *puVar1;
  long lVar2;
  pointer ptVar3;
  shared_count_base *extraout_RDX;
  shared_count_base *extraout_RDX_00;
  shared_count_base *psVar4;
  shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_> sVar5;
  SharedCountAllocator sharedCountAlloc;
  allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>
  local_11;
  
  ptVar3 = allocator<nestl::impl::type_stored_by_value<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>,_nestl::allocator<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>_>_>
           ::allocate<nestl::has_exceptions::exception_ptr_error>
                     (&local_11,(exception_ptr_error *)param_2,1,(void *)0x0);
  if (*(long *)param_2 != 0) {
    (err->m_exception)._M_exception_object = (void *)0x0;
    err[1].m_exception._M_exception_object = (void *)0x0;
    psVar4 = extraout_RDX;
    goto LAB_00109195;
  }
  (ptVar3->super_shared_count_base).m_use_count = 0;
  (ptVar3->super_shared_count_base).m_weak_use_count = 0;
  (ptVar3->super_shared_count_base)._vptr_shared_count_base =
       (_func_int **)&PTR__type_stored_by_value_0010fd58;
  (ptVar3->m_value).m_storage.__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&(ptVar3->m_value).m_storage + 8) = 0;
  *(undefined8 *)((long)&(ptVar3->m_value).m_storage + 0x10) = 0;
  *(undefined8 *)((long)&(ptVar3->m_value).m_storage + 0x18) = 0;
  *(undefined8 *)((long)&(ptVar3->m_value).m_storage + 0x20) = 0;
  *(undefined8 *)((long)&(ptVar3->m_value).m_storage + 0x28) = 0;
  if (*(long *)param_2 == 0) {
    puVar1 = (undefined1 *)((long)&(ptVar3->m_value).m_storage + 8);
    *(undefined8 *)((long)&(ptVar3->m_value).m_storage + 0x18) = 0;
    *(undefined8 *)((long)&(ptVar3->m_value).m_storage + 0x20) = 0;
    *(undefined8 *)((long)&(ptVar3->m_value).m_storage + 8) = 0;
    *(undefined8 *)((long)&(ptVar3->m_value).m_storage + 0x10) = 0;
    *(undefined8 *)((long)&(ptVar3->m_value).m_storage + 0x28) = 0;
    *(undefined1 **)((long)&(ptVar3->m_value).m_storage + 0x18) = puVar1;
    *(undefined1 **)((long)&(ptVar3->m_value).m_storage + 0x20) = puVar1;
    if (*(long *)param_2 != 0) goto LAB_0010918a;
    (err->m_exception)._M_exception_object = &ptVar3->m_value;
    err[1].m_exception._M_exception_object = ptVar3;
    lVar2 = (ptVar3->super_shared_count_base).m_use_count;
    if (lVar2 < 0) {
      __assert_fail("m_use_count >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/shared_ptr.hpp"
                    ,0x2b,"void nestl::impl::shared_count_base::add_ref()");
    }
    (ptVar3->super_shared_count_base).m_use_count = lVar2 + 1;
    ptVar3 = (pointer)0x0;
  }
  else {
LAB_0010918a:
    (err->m_exception)._M_exception_object = (void *)0x0;
    err[1].m_exception._M_exception_object = (void *)0x0;
  }
  operator_delete(ptVar3);
  psVar4 = extraout_RDX_00;
LAB_00109195:
  sVar5.m_refcount = psVar4;
  sVar5.m_ptr = (element_type *)err;
  return sVar5;
}

Assistant:

shared_ptr<T> make_shared_a_nothrow(OperationError& err, Allocator& /* alloc */, Args&& ... args)
{
    static_assert(sizeof(T), "T must be complete type");
    typedef type_stored_by_value<T, Allocator> shared_count_t;
    typedef typename shared_count_t::allocator_type SharedCountAllocator;
    SharedCountAllocator sharedCountAlloc;

    shared_count_t* ptr = allocator_traits<SharedCountAllocator>::allocate(err, sharedCountAlloc, 1);
    if (err)
    {
        return {nullptr};
    }
    nestl::detail::deallocation_scoped_guard<shared_count_t*, SharedCountAllocator> deallocationGuard(sharedCountAlloc, ptr, 1);

    nestl::class_operations::construct(err, ptr, sharedCountAlloc);
    if (err)
    {
        return {nullptr};
    }

    ptr->initialize(err, std::forward<Args>(args) ...);
    if (err)
    {
        return {nullptr};
    }

    deallocationGuard.release();
    return shared_ptr<T>(ptr->get(), ptr);
}